

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::init
          (IdentityGeometryShaderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  NotSupportedError *pNVar5;
  RenderTarget *pRVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  long lVar8;
  Functions *gl;
  undefined1 local_125;
  int local_124;
  string local_120;
  int local_fc;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  undefined1 local_11;
  IdentityGeometryShaderCase *pIStack_10;
  bool supportsES32;
  IdentityGeometryShaderCase *this_local;
  undefined4 extraout_var;
  
  pIStack_10 = this;
  pRVar3 = gles31::Context::getRenderContext
                     ((this->super_IdentityShaderCase).super_TestCase.m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  if ((bool)local_11) {
LAB_0228089f:
    pRVar6 = gles31::Context::getRenderTarget
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    iVar2 = tcu::RenderTarget::getWidth(pRVar6);
    if (0x7f < iVar2) {
      pRVar6 = gles31::Context::getRenderTarget
                         ((this->super_IdentityShaderCase).super_TestCase.m_context);
      iVar2 = tcu::RenderTarget::getHeight(pRVar6);
      if (0x7f < iVar2) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&gl,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&gl,
                            (char (*) [108])
                            "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
                           );
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [99])
                                   "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
                           );
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [44])"Using additive blending to detect overlap.\n");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
        if ((Functional::(anonymous_namespace)::IdentityGeometryShaderCase::init()::patchBufferData
             == '\0') &&
           (iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::
                                         IdentityGeometryShaderCase::init()::patchBufferData),
           iVar2 != 0)) {
          tcu::Vector<float,_4>::Vector(init::patchBufferData,-0.9,-0.9,0.0,1.0);
          tcu::Vector<float,_4>::Vector(init::patchBufferData + 1,-0.9,0.9,0.0,1.0);
          tcu::Vector<float,_4>::Vector(init::patchBufferData + 2,0.9,-0.9,0.0,1.0);
          tcu::Vector<float,_4>::Vector(init::patchBufferData + 3,0.9,0.9,0.0,1.0);
          __cxa_guard_release(&Functional::(anonymous_namespace)::IdentityGeometryShaderCase::init()
                               ::patchBufferData);
        }
        pRVar3 = gles31::Context::getRenderContext
                           ((this->super_IdentityShaderCase).super_TestCase.m_context);
        iVar2 = (*pRVar3->_vptr_RenderContext[3])();
        lVar8 = CONCAT44(extraout_var,iVar2);
        (**(code **)(lVar8 + 0x6c8))(1,&this->m_patchBuffer);
        (**(code **)(lVar8 + 0x40))(0x8892,this->m_patchBuffer);
        (**(code **)(lVar8 + 0x150))(0x8892,0x40,init::patchBufferData,0x88e4);
        err = (**(code **)(lVar8 + 0x800))();
        glu::checkError(err,"gen buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                        ,0xd3);
        return extraout_EAX;
      }
    }
    local_125 = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_fc = 0x80;
    de::toString<int>(&local_f8,&local_fc);
    std::operator+(&local_d8,"Test requires ",&local_f8);
    std::operator+(&local_b8,&local_d8,"x");
    local_124 = 0x80;
    de::toString<int>(&local_120,&local_124);
    std::operator+(&local_98,&local_b8,&local_120);
    std::operator+(&local_78,&local_98," or larger render target.");
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_78);
    local_125 = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pCVar4 = gles31::Context::getContextInfo
                     ((this->super_IdentityShaderCase).super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_tessellation_shader");
  if (bVar1) {
    pCVar4 = gles31::Context::getContextInfo
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_geometry_shader");
    if (bVar1) goto LAB_0228089f;
  }
  local_55 = 1;
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions",
             &local_41);
  tcu::NotSupportedError::NotSupportedError(pNVar5,&local_40);
  local_55 = 0;
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void IdentityGeometryShaderCase::init (void)
{
	// Requirements
	const bool supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 &&
		(!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") ||
		 !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions");

	if (m_context.getRenderTarget().getWidth() < RENDER_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_SIZE) + "x" + de::toString<int>(RENDER_SIZE) + " or larger render target.");

	// Log

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
		<< "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
		<< "Using additive blending to detect overlap.\n"
		<< tcu::TestLog::EndMessage;

	// Resources

	{
		static const tcu::Vec4 patchBufferData[4] =
		{
			tcu::Vec4( -0.9f, -0.9f, 0.0f, 1.0f ),
			tcu::Vec4( -0.9f,  0.9f, 0.0f, 1.0f ),
			tcu::Vec4(  0.9f, -0.9f, 0.0f, 1.0f ),
			tcu::Vec4(  0.9f,  0.9f, 0.0f, 1.0f ),
		};

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genBuffers(1, &m_patchBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_patchBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(patchBufferData), patchBufferData, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffer");
	}
}